

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O2

int __thiscall
Js::LineOffsetCache::GetLineForCharacterOffset
          (LineOffsetCache *this,charcount_t characterOffset,charcount_t *outLineCharOffset,
          charcount_t *outByteOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint *puVar4;
  int iVar5;
  charcount_t cVar6;
  int iVar7;
  int iVar8;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *this_00;
  int local_38;
  charcount_t local_34;
  
  this_00 = (this->lineCharacterOffsetCacheList).ptr;
  iVar7 = this_00->count;
  if (iVar7 < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0x3a,"(this->lineCharacterOffsetCacheList->Count() > 0)",
                                "this->lineCharacterOffsetCacheList->Count() > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    this_00 = (this->lineCharacterOffsetCacheList).ptr;
    iVar7 = this_00->count;
  }
  iVar7 = iVar7 + -1;
  iVar8 = 0;
  local_34 = 0xffffffff;
  local_38 = 0x7fffffff;
  while (iVar8 <= iVar7) {
    cVar6 = (iVar7 - iVar8) / 2 + iVar8;
    puVar4 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Item
                       (this_00,cVar6);
    iVar5 = characterOffset - *puVar4;
    if (iVar5 < 0) {
      iVar7 = cVar6 - 1;
    }
    else {
      if (iVar5 < local_38) {
        local_34 = cVar6;
        local_38 = iVar5;
      }
      iVar8 = cVar6 + 1;
    }
  }
  if ((-1 < (int)local_34) &&
     (cVar6 = GetCharacterOffsetForLine(this,local_34,outByteOffset),
     outLineCharOffset != (charcount_t *)0x0)) {
    *outLineCharOffset = cVar6;
  }
  return local_34;
}

Assistant:

int LineOffsetCache::GetLineForCharacterOffset(charcount_t characterOffset, charcount_t *outLineCharOffset, charcount_t *outByteOffset)
    {
        Assert(this->lineCharacterOffsetCacheList->Count() > 0);

        // The list is sorted, so binary search to find the line info.
        int closestIndex = -1;
        int minRange = INT_MAX;

        this->lineCharacterOffsetCacheList->BinarySearch([&](const charcount_t item, int index)
        {
            int offsetRange = characterOffset - item;
            if (offsetRange >= 0)
            {
                if (offsetRange < minRange)
                {
                    // There are potentially many lines with starting offsets greater than the one we're searching
                    // for.  As a result, we should track which index we've encountered so far that is the closest
                    // to the offset we're looking for without going under.  This will find the line that contains
                    // the offset.
                    closestIndex = index;
                    minRange = offsetRange;
                }

                // Search lower to see if we can find a closer index.
                return -1;
            }
            else
            {
                // Search higher to get into a range that is greater than the offset.
                return 1;
            }

            // Note that we purposely don't return 0 (==) here.  We want the search to end in failure (-1) because
            // we're searching for the closest element, not necessarily an exact element offset.  Exact offsets
            // are possible when the offset we're searching for is the first character of the line, but that will
            // be handled by the if statement above.
        });

        if (closestIndex >= 0)
        {
            charcount_t lastItemCharacterOffset = GetCharacterOffsetForLine(closestIndex, outByteOffset);

            if (outLineCharOffset != nullptr)
            {
                *outLineCharOffset = lastItemCharacterOffset;
            }
        }

        return closestIndex;
    }